

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int sqlite3Fts3EvalTestDeferred(Fts3Cursor *pCsr,int *pRc)

{
  int iVar1;
  sqlite3_vtab *psVar2;
  sqlite3_module *pTokenizer;
  sqlite3_tokenizer_module *psVar3;
  Fts3DeferredToken *pFVar4;
  Fts3PhraseToken *pFVar5;
  int iVar6;
  sqlite3_tokenizer_cursor *psVar7;
  uint uVar8;
  int iVar9;
  int iVar10;
  sqlite3_int64 iDocid;
  uchar *z;
  Fts3DeferredToken **ppFVar11;
  long lVar12;
  long iCol;
  Fts3DeferredToken **ppFVar13;
  long in_FS_OFFSET;
  bool bVar14;
  int rc;
  int local_60;
  int iDum2;
  int iDum1;
  int nToken;
  char *zToken;
  sqlite3_tokenizer_cursor *pTC;
  int local_3c;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  rc = *pRc;
  uVar8 = 0;
  if (rc != 0) goto LAB_001b429a;
  ppFVar13 = &pCsr->pDeferred;
  iVar9 = rc;
  if (pCsr->pDeferred != (Fts3DeferredToken *)0x0) {
    rc = fts3CursorSeek((sqlite3_context *)0x0,pCsr);
    iVar9 = rc;
    if ((rc == 0) && (iVar9 = 0, *ppFVar13 != (Fts3DeferredToken *)0x0)) {
      psVar2 = (pCsr->base).pVtab;
      pTokenizer = psVar2[3].pModule;
      psVar3 = *(sqlite3_tokenizer_module **)&pTokenizer->iVersion;
      iVar9 = 0;
      iDocid = sqlite3_column_int64(pCsr->pStmt,0);
      lVar12 = 0;
      do {
        bVar14 = iVar9 == 0;
        iCol = lVar12;
        while( true ) {
          lVar12 = iCol + 1;
          ppFVar11 = ppFVar13;
          if ((!bVar14) || (*(int *)&psVar2[2].pModule <= iCol)) goto LAB_001b422a;
          if (psVar2[2].zErrMsg[iCol] == '\0') break;
          bVar14 = true;
          iCol = lVar12;
        }
        z = sqlite3_column_text(pCsr->pStmt,(int)lVar12);
        pTC = (sqlite3_tokenizer_cursor *)0x0;
        iVar9 = sqlite3Fts3OpenTokenizer
                          ((sqlite3_tokenizer *)pTokenizer,pCsr->iLangid,(char *)z,-1,&pTC);
        psVar7 = pTC;
        while (iVar9 == 0) {
          nToken = 0;
          iDum1 = 0;
          iDum2 = 0;
          zToken = &DAT_aaaaaaaaaaaaaaaa;
          local_60 = 0;
          iVar9 = (*psVar3->xNext)(psVar7,&zToken,&nToken,&iDum1,&iDum2,&local_60);
          ppFVar11 = ppFVar13;
          local_3c = iVar9;
          while ((iVar6 = local_60, pFVar4 = *ppFVar11, pFVar4 != (Fts3DeferredToken *)0x0 &&
                 (iVar9 == 0))) {
            pFVar5 = pFVar4->pToken;
            iVar10 = 0;
            iVar9 = 0;
            if (((lVar12 - (ulong)(uint)pFVar4->iCol == 1) ||
                (*(int *)&psVar2[2].pModule <= pFVar4->iCol)) &&
               (local_60 == 0 || pFVar5->bFirst == 0)) {
              iVar1 = pFVar5->n;
              iVar9 = iVar10;
              if (((iVar1 == nToken) || ((iVar1 < nToken && (pFVar5->isPrefix != 0)))) &&
                 (iVar10 = bcmp(zToken,pFVar5->z,(long)iVar1), iVar10 == 0)) {
                fts3PendingListAppend(&pFVar4->pList,iDocid,iCol,(long)iVar6,&local_3c);
                iVar9 = local_3c;
              }
            }
            ppFVar11 = &pFVar4->pNext;
          }
        }
        if (psVar7 != (sqlite3_tokenizer_cursor *)0x0) {
          (*psVar3->xClose)(psVar7);
        }
        if (iVar9 == 0x65) {
          local_3c = 0;
          iVar9 = 0;
        }
      } while( true );
    }
  }
  goto LAB_001b425c;
LAB_001b422a:
  while ((pFVar4 = *ppFVar11, pFVar4 != (Fts3DeferredToken *)0x0 && (iVar9 == 0))) {
    if (pFVar4->pList == (PendingList *)0x0) {
      iVar9 = 0;
    }
    else {
      iVar9 = fts3PendingListAppendVarint(&pFVar4->pList,0);
    }
    ppFVar11 = &pFVar4->pNext;
  }
LAB_001b425c:
  rc = iVar9;
  iVar9 = fts3EvalTestExpr(pCsr,pCsr->pExpr,&rc);
  while (pFVar4 = *ppFVar13, pFVar4 != (Fts3DeferredToken *)0x0) {
    sqlite3_free(pFVar4->pList);
    pFVar4->pList = (PendingList *)0x0;
    ppFVar13 = &pFVar4->pNext;
  }
  *pRc = rc;
  uVar8 = (uint)(iVar9 == 0 && rc == 0);
LAB_001b429a:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return uVar8;
}

Assistant:

SQLITE_PRIVATE int sqlite3Fts3EvalTestDeferred(Fts3Cursor *pCsr, int *pRc){
  int rc = *pRc;
  int bMiss = 0;
  if( rc==SQLITE_OK ){

    /* If there are one or more deferred tokens, load the current row into
    ** memory and scan it to determine the position list for each deferred
    ** token. Then, see if this row is really a match, considering deferred
    ** tokens and NEAR operators (neither of which were taken into account
    ** earlier, by fts3EvalNextRow()).
    */
    if( pCsr->pDeferred ){
      rc = fts3CursorSeek(0, pCsr);
      if( rc==SQLITE_OK ){
        rc = sqlite3Fts3CacheDeferredDoclists(pCsr);
      }
    }
    bMiss = (0==fts3EvalTestExpr(pCsr, pCsr->pExpr, &rc));

    /* Free the position-lists accumulated for each deferred token above. */
    sqlite3Fts3FreeDeferredDoclists(pCsr);
    *pRc = rc;
  }
  return (rc==SQLITE_OK && bMiss);
}